

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O2

void Sle_ManPrintCuts(Gia_Man_t *p,Vec_Int_t *vCuts,int iObj)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  
  iVar1 = Vec_IntEntry(vCuts,iObj);
  puVar2 = (uint *)Vec_IntEntryP(vCuts,iVar1);
  printf("Obj %3d\n",(ulong)(uint)iObj);
  puVar3 = puVar2;
  for (iVar1 = 0; puVar3 = puVar3 + 1, iVar1 < (int)*puVar2; iVar1 = iVar1 + 1) {
    Sle_ManPrintCut((int *)puVar3);
    puVar3 = puVar3 + (*puVar3 & 0xf);
  }
  putchar(10);
  return;
}

Assistant:

void Sle_ManPrintCuts( Gia_Man_t * p, Vec_Int_t * vCuts, int iObj )
{
    int i, * pCut;
    int * pList = Vec_IntEntryP( vCuts, Vec_IntEntry(vCuts, iObj) );
    printf( "Obj %3d\n", iObj );
    Sle_ForEachCut( pList, pCut, i )
        Sle_ManPrintCut( pCut );
    printf( "\n" );
}